

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O2

int parse_codes(archive_read *a)

{
  rar_br *br;
  uchar *lengths;
  CPpmd7 *p;
  void *pvVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Bool BVar6;
  ulong uVar7;
  long lVar8;
  void *__s;
  byte bVar9;
  ulong uVar10;
  char *fmt;
  long lVar11;
  char in_R8B;
  uint uVar12;
  huffman_code precode;
  uchar bitlengths [20];
  
  pvVar1 = a->format->data;
  br = (rar_br *)((long)pvVar1 + 0x4ec8);
  free_codes(a);
  uVar2 = *(uint *)((long)pvVar1 + 0x4ed0) & 0xfffffff8;
  *(uint *)((long)pvVar1 + 0x4ed0) = uVar2;
  if ((int)uVar2 < 1) {
    iVar3 = rar_br_fillup(a,br);
    uVar2 = *(uint *)((long)pvVar1 + 0x4ed0);
    if ((int)uVar2 < 1 && iVar3 == 0) goto LAB_0012fa7a;
  }
  iVar3 = uVar2 - 1;
  uVar10 = *(ulong *)((long)pvVar1 + 0x4ec8) >> ((byte)iVar3 & 0x3f);
  *(byte *)((long)pvVar1 + 0x36b) = (byte)uVar10 & 1;
  *(int *)((long)pvVar1 + 0x4ed0) = iVar3;
  if ((uVar10 & 1) == 0) {
    if ((int)uVar2 < 2) {
      iVar4 = rar_br_fillup(a,br);
      iVar3 = *(int *)((long)pvVar1 + 0x4ed0);
      if (iVar3 < 1 && iVar4 == 0) goto LAB_0012fa7a;
    }
    uVar10 = (ulong)(iVar3 - 1U);
    if ((br->cache_buffer >> (uVar10 & 0x3f) & 1) == 0) {
      memset((void *)((long)pvVar1 + 0x188),0,0x194);
    }
    *(uint *)((long)pvVar1 + 0x4ed0) = iVar3 - 1U;
    bitlengths[0] = '\0';
    bitlengths[1] = '\0';
    bitlengths[2] = '\0';
    bitlengths[3] = '\0';
    bitlengths[4] = '\0';
    bitlengths[5] = '\0';
    bitlengths[6] = '\0';
    bitlengths[7] = '\0';
    bitlengths[8] = '\0';
    bitlengths[9] = '\0';
    bitlengths[10] = '\0';
    bitlengths[0xb] = '\0';
    bitlengths[0xc] = '\0';
    bitlengths[0xd] = '\0';
    bitlengths[0xe] = '\0';
    bitlengths[0xf] = '\0';
    bitlengths[0x10] = '\0';
    bitlengths[0x11] = '\0';
    bitlengths[0x12] = '\0';
    bitlengths[0x13] = '\0';
    iVar3 = 0;
    while (iVar4 = iVar3, iVar4 < 0x14) {
      iVar5 = (int)uVar10;
      if (iVar5 < 4) {
        iVar3 = rar_br_fillup(a,br);
        iVar5 = *(int *)((long)pvVar1 + 0x4ed0);
        if (iVar5 < 4 && iVar3 == 0) goto LAB_0012fa7a;
      }
      uVar2 = iVar5 - 4;
      uVar10 = (ulong)uVar2;
      bVar9 = (byte)(*(ulong *)((long)pvVar1 + 0x4ec8) >> ((byte)uVar2 & 0x3f)) & 0xf;
      lVar11 = (long)iVar4;
      bitlengths[lVar11] = bVar9;
      *(uint *)((long)pvVar1 + 0x4ed0) = uVar2;
      iVar3 = iVar4 + 1;
      if (bVar9 == 0xf) {
        if (iVar5 < 8) {
          iVar5 = rar_br_fillup(a,br);
          uVar2 = *(uint *)((long)pvVar1 + 0x4ed0);
          if ((int)uVar2 < 4 && iVar5 == 0) goto LAB_0012fa7a;
        }
        uVar2 = uVar2 - 4;
        uVar10 = (ulong)uVar2;
        uVar7 = *(ulong *)((long)pvVar1 + 0x4ec8) >> ((byte)uVar2 & 0x3f);
        *(uint *)((long)pvVar1 + 0x4ed0) = uVar2;
        if ((uVar7 & 0xf) != 0) {
          for (lVar8 = 0;
              ((uint)lVar8 < (uint)(byte)(((byte)uVar7 & 0xf) + 2) && (lVar8 + lVar11 < 0x14));
              lVar8 = lVar8 + 1) {
            bitlengths[lVar8 + lVar11] = '\0';
          }
          iVar3 = iVar4 + (uint)lVar8;
        }
      }
    }
    precode.maxlength = 0;
    precode.tablesize = 0;
    precode.table = (huffman_table_entry *)0x0;
    precode.tree = (huffman_tree_node *)0x0;
    precode.numentries = 0;
    precode.minlength = 0;
    iVar3 = create_code(a,&precode,bitlengths,0x14,in_R8B);
    if (iVar3 != 0) {
      free(precode.tree);
      free(precode.table);
      return iVar3;
    }
    lengths = (uchar *)((long)pvVar1 + 0x188);
    iVar3 = 0;
    while (iVar3 < 0x194) {
      uVar2 = read_next_symbol(a,&precode);
      if ((int)uVar2 < 0) {
        free(precode.tree);
        free(precode.table);
        return -0x1e;
      }
      lVar11 = (long)iVar3;
      if (uVar2 < 0x10) {
        lengths[lVar11] = (char)uVar2 + lengths[lVar11] & 0xf;
        iVar3 = iVar3 + 1;
      }
      else {
        if (uVar2 < 0x12) {
          if (iVar3 == 0) {
            free(precode.tree);
            free(precode.table);
            fmt = "Internal error extracting RAR file.";
            goto LAB_0012f979;
          }
          iVar4 = *(int *)((long)pvVar1 + 0x4ed0);
          if (uVar2 == 0x10) {
            if (iVar4 < 3) {
              iVar5 = rar_br_fillup(a,br);
              iVar4 = *(int *)((long)pvVar1 + 0x4ed0);
              if (iVar4 < 3 && iVar5 == 0) goto LAB_0012fa66;
            }
            iVar4 = iVar4 + -3;
            uVar2 = 7;
            iVar5 = 3;
          }
          else {
            if (iVar4 < 7) {
              iVar5 = rar_br_fillup(a,br);
              iVar4 = *(int *)((long)pvVar1 + 0x4ed0);
              if (iVar4 < 7 && iVar5 == 0) goto LAB_0012fa66;
            }
            iVar4 = iVar4 + -7;
            uVar2 = 0x7f;
            iVar5 = 0xb;
          }
          uVar10 = *(ulong *)((long)pvVar1 + 0x4ec8);
          *(int *)((long)pvVar1 + 0x4ed0) = iVar4;
          for (lVar8 = 0;
              ((uint)lVar8 < ((uint)(uVar10 >> ((byte)iVar4 & 0x3f)) & uVar2) + iVar5 &&
              (lVar11 + lVar8 < 0x194)); lVar8 = lVar8 + 1) {
            lengths[lVar8 + lVar11] = lengths[lVar8 + lVar11 + -1];
          }
        }
        else {
          iVar4 = *(int *)((long)pvVar1 + 0x4ed0);
          if (uVar2 == 0x12) {
            if (iVar4 < 3) {
              iVar5 = rar_br_fillup(a,br);
              iVar4 = *(int *)((long)pvVar1 + 0x4ed0);
              if (iVar4 < 3 && iVar5 == 0) {
LAB_0012fa66:
                free(precode.tree);
                free(precode.table);
                goto LAB_0012fa7a;
              }
            }
            iVar4 = iVar4 + -3;
            uVar2 = 7;
            iVar5 = 3;
          }
          else {
            if (iVar4 < 7) {
              iVar5 = rar_br_fillup(a,br);
              iVar4 = *(int *)((long)pvVar1 + 0x4ed0);
              if (iVar4 < 7 && iVar5 == 0) goto LAB_0012fa66;
            }
            iVar4 = iVar4 + -7;
            uVar2 = 0x7f;
            iVar5 = 0xb;
          }
          uVar10 = *(ulong *)((long)pvVar1 + 0x4ec8);
          *(int *)((long)pvVar1 + 0x4ed0) = iVar4;
          for (lVar8 = 0;
              ((uint)lVar8 < ((uint)(uVar10 >> ((byte)iVar4 & 0x3f)) & uVar2) + iVar5 &&
              (lVar11 + lVar8 < 0x194)); lVar8 = lVar8 + 1) {
            lengths[lVar8 + lVar11] = '\0';
          }
        }
        iVar3 = iVar3 + (int)lVar8;
      }
    }
    free(precode.tree);
    free(precode.table);
    iVar3 = create_code(a,(huffman_code *)((long)pvVar1 + 0x108),lengths,299,in_R8B);
    if (iVar3 != 0) {
      return iVar3;
    }
    iVar3 = create_code(a,(huffman_code *)((long)pvVar1 + 0x128),(uchar *)((long)pvVar1 + 0x2b3),
                        0x3c,in_R8B);
    if (iVar3 != 0) {
      return iVar3;
    }
    iVar3 = create_code(a,(huffman_code *)((long)pvVar1 + 0x148),(uchar *)((long)pvVar1 + 0x2ef),
                        0x11,in_R8B);
    if (iVar3 != 0) {
      return iVar3;
    }
    iVar3 = create_code(a,(huffman_code *)((long)pvVar1 + 0x168),(uchar *)((long)pvVar1 + 0x300),
                        0x1c,in_R8B);
    if (iVar3 != 0) {
      return iVar3;
    }
LAB_0012f8cc:
    if ((*(int *)((long)pvVar1 + 0xe0) != 0) && (*(long *)((long)pvVar1 + 800) != 0)) {
LAB_0012f95a:
      *(undefined1 *)((long)pvVar1 + 0x368) = 0;
      return 0;
    }
    uVar10 = *(ulong *)((long)pvVar1 + 0x28);
    uVar2 = 0x400000;
    if ((long)uVar10 < 0x400000) {
      uVar2 = (uint)(uVar10 >> 1) & 0x7fffffff | (uint)uVar10;
      uVar2 = uVar2 >> 2 | uVar2;
      uVar2 = uVar2 >> 4 | uVar2;
      uVar2 = uVar2 >> 8 | uVar2;
      uVar2 = uVar2 >> 0x10 | uVar2;
      uVar2 = (uVar2 - (uVar2 >> 1)) * 2;
    }
    __s = realloc(*(void **)((long)pvVar1 + 800),(ulong)uVar2);
    if (__s != (void *)0x0) {
      *(void **)((long)pvVar1 + 800) = __s;
      *(uint *)((long)pvVar1 + 0xe0) = uVar2;
      memset(__s,0,(ulong)uVar2);
      *(uint *)((long)pvVar1 + 0x328) = uVar2 - 1;
      goto LAB_0012f95a;
    }
    fmt = "Unable to allocate memory for uncompressed data.";
LAB_0012fa37:
    iVar3 = 0xc;
  }
  else {
    if ((int)uVar2 < 8) {
      iVar4 = rar_br_fillup(a,br);
      iVar3 = *(int *)((long)pvVar1 + 0x4ed0);
      if (iVar3 < 7 && iVar4 == 0) goto LAB_0012fa7a;
    }
    iVar4 = iVar3 + -7;
    uVar10 = *(ulong *)((long)pvVar1 + 0x4ec8) >> ((byte)iVar4 & 0x3f);
    *(int *)((long)pvVar1 + 0x4ed0) = iVar4;
    if ((uVar10 & 0x20) != 0) {
      if (iVar3 < 0xf) {
        iVar3 = rar_br_fillup(a,br);
        iVar4 = *(int *)((long)pvVar1 + 0x4ed0);
        if (iVar4 < 8 && iVar3 == 0) goto LAB_0012fa7a;
      }
      iVar4 = iVar4 + -8;
      *(uint *)((long)pvVar1 + 0xe0) =
           ((uint)(*(ulong *)((long)pvVar1 + 0x4ec8) >> ((byte)iVar4 & 0x3f)) & 0xff) * 0x100000 +
           0x100000;
      *(int *)((long)pvVar1 + 0x4ed0) = iVar4;
    }
    if ((uVar10 & 0x40) == 0) {
      *(undefined4 *)((long)pvVar1 + 0x36c) = 2;
    }
    else {
      if (iVar4 < 8) {
        iVar3 = rar_br_fillup(a,br);
        iVar4 = *(int *)((long)pvVar1 + 0x4ed0);
        if (iVar4 < 8 && iVar3 == 0) {
LAB_0012fa7a:
          archive_set_error(&a->archive,0x54,"Truncated RAR file data");
          *(undefined1 *)((long)pvVar1 + 200) = 0;
          return -0x1e;
        }
      }
      uVar2 = (uint)(*(ulong *)((long)pvVar1 + 0x4ec8) >> ((byte)(iVar4 + -8) & 0x3f)) & 0xff;
      *(uint *)((long)pvVar1 + 0x38c) = uVar2;
      *(uint *)((long)pvVar1 + 0x36c) = uVar2;
      *(int *)((long)pvVar1 + 0x4ed0) = iVar4 + -8;
    }
    if ((uVar10 & 0x20) == 0) {
      if (*(char *)((long)pvVar1 + 0x369) == '\0') {
        fmt = "Invalid PPMd sequence";
      }
      else {
        BVar6 = PpmdRAR_RangeDec_Init((CPpmd7z_RangeDec *)((long)pvVar1 + 0x4e60));
        if (BVar6 != 0) goto LAB_0012f8cc;
LAB_0012f972:
        fmt = "Unable to initialize PPMd range decoder";
      }
    }
    else {
      uVar12 = (uint)uVar10 & 0x1f;
      uVar2 = uVar12 * 3 - 0x1d;
      if (uVar12 < 0x10) {
        uVar2 = uVar12 + 1;
      }
      if (uVar2 != 1) {
        p = (CPpmd7 *)((long)pvVar1 + 0x370);
        Ppmd7_Free(p,&g_szalloc);
        *(archive_read **)((long)pvVar1 + 0x4e90) = a;
        *(code **)((long)pvVar1 + 0x4e98) = ppmd_read;
        PpmdRAR_RangeDec_CreateVTable((CPpmd7z_RangeDec *)((long)pvVar1 + 0x4e60));
        *(long *)((long)pvVar1 + 0x4e88) = (long)pvVar1 + 0x4e90;
        Ppmd7_Construct(p);
        BVar6 = Ppmd7_Alloc(p,*(UInt32 *)((long)pvVar1 + 0xe0),&g_szalloc);
        if (BVar6 != 0) {
          BVar6 = PpmdRAR_RangeDec_Init((CPpmd7z_RangeDec *)((long)pvVar1 + 0x4e60));
          if (BVar6 == 0) goto LAB_0012f972;
          Ppmd7_Init(p,uVar2);
          *(undefined1 *)((long)pvVar1 + 0x369) = 1;
          goto LAB_0012f8cc;
        }
        fmt = "Out of memory";
        goto LAB_0012fa37;
      }
      fmt = "Truncated RAR file data";
    }
LAB_0012f979:
    iVar3 = 0x54;
  }
  archive_set_error(&a->archive,iVar3,fmt);
  return -0x1e;
}

Assistant:

static int
parse_codes(struct archive_read *a)
{
  int i, j, val, n, r;
  unsigned char bitlengths[MAX_SYMBOLS], zerocount, ppmd_flags;
  unsigned int maxorder;
  struct huffman_code precode;
  struct rar *rar = (struct rar *)(a->format->data);
  struct rar_br *br = &(rar->br);

  free_codes(a);

  /* Skip to the next byte */
  rar_br_consume_unalined_bits(br);

  /* PPMd block flag */
  if (!rar_br_read_ahead(a, br, 1))
    goto truncated_data;
  if ((rar->is_ppmd_block = rar_br_bits(br, 1)) != 0)
  {
    rar_br_consume(br, 1);
    if (!rar_br_read_ahead(a, br, 7))
      goto truncated_data;
    ppmd_flags = rar_br_bits(br, 7);
    rar_br_consume(br, 7);

    /* Memory is allocated in MB */
    if (ppmd_flags & 0x20)
    {
      if (!rar_br_read_ahead(a, br, 8))
        goto truncated_data;
      rar->dictionary_size = (rar_br_bits(br, 8) + 1) << 20;
      rar_br_consume(br, 8);
    }

    if (ppmd_flags & 0x40)
    {
      if (!rar_br_read_ahead(a, br, 8))
        goto truncated_data;
      rar->ppmd_escape = rar->ppmd7_context.InitEsc = rar_br_bits(br, 8);
      rar_br_consume(br, 8);
    }
    else
      rar->ppmd_escape = 2;

    if (ppmd_flags & 0x20)
    {
      maxorder = (ppmd_flags & 0x1F) + 1;
      if(maxorder > 16)
        maxorder = 16 + (maxorder - 16) * 3;

      if (maxorder == 1)
      {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                          "Truncated RAR file data");
        return (ARCHIVE_FATAL);
      }

      /* Make sure ppmd7_contest is freed before Ppmd7_Construct
       * because reading a broken file cause this abnormal sequence. */
      __archive_ppmd7_functions.Ppmd7_Free(&rar->ppmd7_context, &g_szalloc);

      rar->bytein.a = a;
      rar->bytein.Read = &ppmd_read;
      __archive_ppmd7_functions.PpmdRAR_RangeDec_CreateVTable(&rar->range_dec);
      rar->range_dec.Stream = &rar->bytein;
      __archive_ppmd7_functions.Ppmd7_Construct(&rar->ppmd7_context);

      if (!__archive_ppmd7_functions.Ppmd7_Alloc(&rar->ppmd7_context,
        rar->dictionary_size, &g_szalloc))
      {
        archive_set_error(&a->archive, ENOMEM,
                          "Out of memory");
        return (ARCHIVE_FATAL);
      }
      if (!__archive_ppmd7_functions.PpmdRAR_RangeDec_Init(&rar->range_dec))
      {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                          "Unable to initialize PPMd range decoder");
        return (ARCHIVE_FATAL);
      }
      __archive_ppmd7_functions.Ppmd7_Init(&rar->ppmd7_context, maxorder);
      rar->ppmd_valid = 1;
    }
    else
    {
      if (!rar->ppmd_valid) {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                          "Invalid PPMd sequence");
        return (ARCHIVE_FATAL);
      }
      if (!__archive_ppmd7_functions.PpmdRAR_RangeDec_Init(&rar->range_dec))
      {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                          "Unable to initialize PPMd range decoder");
        return (ARCHIVE_FATAL);
      }
    }
  }
  else
  {
    rar_br_consume(br, 1);

    /* Keep existing table flag */
    if (!rar_br_read_ahead(a, br, 1))
      goto truncated_data;
    if (!rar_br_bits(br, 1))
      memset(rar->lengthtable, 0, sizeof(rar->lengthtable));
    rar_br_consume(br, 1);

    memset(&bitlengths, 0, sizeof(bitlengths));
    for (i = 0; i < MAX_SYMBOLS;)
    {
      if (!rar_br_read_ahead(a, br, 4))
        goto truncated_data;
      bitlengths[i++] = rar_br_bits(br, 4);
      rar_br_consume(br, 4);
      if (bitlengths[i-1] == 0xF)
      {
        if (!rar_br_read_ahead(a, br, 4))
          goto truncated_data;
        zerocount = rar_br_bits(br, 4);
        rar_br_consume(br, 4);
        if (zerocount)
        {
          i--;
          for (j = 0; j < zerocount + 2 && i < MAX_SYMBOLS; j++)
            bitlengths[i++] = 0;
        }
      }
    }

    memset(&precode, 0, sizeof(precode));
    r = create_code(a, &precode, bitlengths, MAX_SYMBOLS, MAX_SYMBOL_LENGTH);
    if (r != ARCHIVE_OK) {
      free(precode.tree);
      free(precode.table);
      return (r);
    }

    for (i = 0; i < HUFFMAN_TABLE_SIZE;)
    {
      if ((val = read_next_symbol(a, &precode)) < 0) {
        free(precode.tree);
        free(precode.table);
        return (ARCHIVE_FATAL);
      }
      if (val < 16)
      {
        rar->lengthtable[i] = (rar->lengthtable[i] + val) & 0xF;
        i++;
      }
      else if (val < 18)
      {
        if (i == 0)
        {
          free(precode.tree);
          free(precode.table);
          archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                            "Internal error extracting RAR file.");
          return (ARCHIVE_FATAL);
        }

        if(val == 16) {
          if (!rar_br_read_ahead(a, br, 3)) {
            free(precode.tree);
            free(precode.table);
            goto truncated_data;
          }
          n = rar_br_bits(br, 3) + 3;
          rar_br_consume(br, 3);
        } else {
          if (!rar_br_read_ahead(a, br, 7)) {
            free(precode.tree);
            free(precode.table);
            goto truncated_data;
          }
          n = rar_br_bits(br, 7) + 11;
          rar_br_consume(br, 7);
        }

        for (j = 0; j < n && i < HUFFMAN_TABLE_SIZE; j++)
        {
          rar->lengthtable[i] = rar->lengthtable[i-1];
          i++;
        }
      }
      else
      {
        if(val == 18) {
          if (!rar_br_read_ahead(a, br, 3)) {
            free(precode.tree);
            free(precode.table);
            goto truncated_data;
          }
          n = rar_br_bits(br, 3) + 3;
          rar_br_consume(br, 3);
        } else {
          if (!rar_br_read_ahead(a, br, 7)) {
            free(precode.tree);
            free(precode.table);
            goto truncated_data;
          }
          n = rar_br_bits(br, 7) + 11;
          rar_br_consume(br, 7);
        }

        for(j = 0; j < n && i < HUFFMAN_TABLE_SIZE; j++)
          rar->lengthtable[i++] = 0;
      }
    }
    free(precode.tree);
    free(precode.table);

    r = create_code(a, &rar->maincode, &rar->lengthtable[0], MAINCODE_SIZE,
                MAX_SYMBOL_LENGTH);
    if (r != ARCHIVE_OK)
      return (r);
    r = create_code(a, &rar->offsetcode, &rar->lengthtable[MAINCODE_SIZE],
                OFFSETCODE_SIZE, MAX_SYMBOL_LENGTH);
    if (r != ARCHIVE_OK)
      return (r);
    r = create_code(a, &rar->lowoffsetcode,
                &rar->lengthtable[MAINCODE_SIZE + OFFSETCODE_SIZE],
                LOWOFFSETCODE_SIZE, MAX_SYMBOL_LENGTH);
    if (r != ARCHIVE_OK)
      return (r);
    r = create_code(a, &rar->lengthcode,
                &rar->lengthtable[MAINCODE_SIZE + OFFSETCODE_SIZE +
                LOWOFFSETCODE_SIZE], LENGTHCODE_SIZE, MAX_SYMBOL_LENGTH);
    if (r != ARCHIVE_OK)
      return (r);
  }

  if (!rar->dictionary_size || !rar->lzss.window)
  {
    /* Seems as though dictionary sizes are not used. Even so, minimize
     * memory usage as much as possible.
     */
    void *new_window;
    unsigned int new_size;

    if (rar->unp_size >= DICTIONARY_MAX_SIZE)
      new_size = DICTIONARY_MAX_SIZE;
    else
      new_size = rar_fls((unsigned int)rar->unp_size) << 1;
    new_window = realloc(rar->lzss.window, new_size);
    if (new_window == NULL) {
      archive_set_error(&a->archive, ENOMEM,
                        "Unable to allocate memory for uncompressed data.");
      return (ARCHIVE_FATAL);
    }
    rar->lzss.window = (unsigned char *)new_window;
    rar->dictionary_size = new_size;
    memset(rar->lzss.window, 0, rar->dictionary_size);
    rar->lzss.mask = rar->dictionary_size - 1;
  }

  rar->start_new_table = 0;
  return (ARCHIVE_OK);
truncated_data:
  archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                    "Truncated RAR file data");
  rar->valid = 0;
  return (ARCHIVE_FATAL);
}